

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

char * alarm_id_to_string(uint8_t alarm_id)

{
  uint local_10;
  int alarm_index;
  uint8_t alarm_id_local;
  
  if (alarm_id == 'c') {
    local_10 = 0x28;
  }
  else if (alarm_id < 0x28) {
    local_10 = (uint)alarm_id;
  }
  else {
    local_10 = 0x29;
  }
  return alarm_type_str[(int)local_10];
}

Assistant:

const char* alarm_id_to_string(uint8_t alarm_id) {
    int alarm_index;

    /* Our Alarm Table only has 41 entries, if alarm is 99 (Un-Alarm) set it to 40,
     * if our alarm is > 39 (last valid alarm, except 99) then use alarm 41 to display
     * "Unknown Alarm."
     */
    if (alarm_id == 99) {
        alarm_index = 40;
    } else if (alarm_id > 39) {
        alarm_index = 41;
    } else {
        alarm_index = alarm_id;
    }

    return alarm_type_str[alarm_index];
}